

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

FrameSequence *
deqp::egl::anon_unknown_0::generateFrameSequence
          (FrameSequence *__return_storage_ptr__,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType,Random *rnd,int numFrames,int width,int height)

{
  undefined1 uVar1;
  DrawType DVar2;
  pointer pFVar3;
  int i;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  long lVar7;
  pointer pDVar8;
  pointer pDVar9;
  pointer pFVar10;
  pointer pFVar11;
  pointer pDVar12;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  Frame *__args;
  Frame *extraout_RDX_01;
  Frame *extraout_RDX_02;
  Frame *extraout_RDX_03;
  Frame *extraout_RDX_04;
  Frame *extraout_RDX_05;
  Frame *extraout_RDX_06;
  ulong uVar13;
  pointer pFVar14;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
  *this;
  ulong uVar15;
  long lVar16;
  int iVar17;
  pointer __a;
  pointer pDVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  DrawCommand drawCommand;
  uint local_b4;
  pointer local_b0;
  pointer local_98;
  Frame local_88;
  DrawType local_68;
  undefined4 local_64;
  int local_60;
  int local_5c;
  int local_58;
  undefined2 local_54;
  undefined1 local_52;
  ulong local_50;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *local_48;
  ulong local_40;
  long local_38;
  
  local_50 = (ulong)(uint)(width / 0x18);
  dVar4 = deRandom_getUint32(&rnd->m_rnd);
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  dVar6 = deRandom_getUint32(&rnd->m_rnd);
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __a = (pointer)0x0;
  local_40 = 0x7ffffffffffffff8;
  local_b4 = 0;
  __args = extraout_RDX;
  local_48 = frameDrawType;
  do {
    local_88.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar12 = (frameDrawType->
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar15 = (ulong)((long)(frameDrawType->
                           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) >> 2;
    local_88.width = numFrames;
    local_88.height = width;
    if ((int)uVar15 < 1) {
      local_b0 = (pointer)0x0;
    }
    else {
      iVar17 = local_b4 * (int)local_50;
      lVar16 = 0;
      local_98 = (pointer)0x0;
      local_b0 = (pointer)0x0;
      uVar13 = local_50;
      do {
        iVar21 = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                      (long)(int)uVar15);
        iVar20 = (int)lVar16 * iVar21 + iVar17;
        DVar2 = pDVar12[lVar16];
        __args = (Frame *)(ulong)DVar2;
        lVar16 = lVar16 + 1;
        iVar21 = (int)lVar16 * iVar21 + iVar17;
        local_64 = 0;
        local_54 = CONCAT11((char)dVar5,(char)dVar4);
        local_52 = (char)dVar6;
        local_68 = DVar2;
        local_60 = iVar20;
        local_5c = numFrames;
        local_58 = iVar21;
        if (local_88.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish == local_98) {
          uVar15 = (long)local_98 - (long)local_b0;
          if (uVar15 == local_40) {
            local_88.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_start = local_b0;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar19 = ((long)uVar15 >> 3) * -0x5555555555555555;
          uVar13 = uVar19;
          if (local_98 == local_b0) {
            uVar13 = 1;
          }
          this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  *)(uVar13 + uVar19);
          if ((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               *)0x555555555555554 < this) {
            this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    *)0x555555555555555;
          }
          if (CARRY8(uVar13,uVar19)) {
            this = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    *)0x555555555555555;
          }
          local_38 = lVar16;
          pDVar8 = std::
                   _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   ::_M_allocate(this,(size_t)local_b0);
          *(DrawType *)((long)pDVar8 + uVar15) = DVar2;
          *(undefined4 *)((long)pDVar8 + uVar15 + 4) = 0;
          *(int *)((long)pDVar8 + uVar15 + 8) = iVar20;
          *(int *)((long)pDVar8 + uVar15 + 0xc) = numFrames;
          *(int *)((long)pDVar8 + uVar15 + 0x10) = iVar21;
          *(undefined2 *)((long)pDVar8 + uVar15 + 0x14) = local_54;
          *(undefined1 *)((long)pDVar8 + uVar15 + 0x16) = local_52;
          pDVar18 = pDVar8;
          __args = extraout_RDX_00;
          for (pDVar9 = local_b0; local_98 != pDVar9; pDVar9 = pDVar9 + 1) {
            iVar21 = (pDVar9->rect).bottomLeft.m_data[0];
            pDVar18->drawType = pDVar9->drawType;
            (pDVar18->rect).bottomLeft.m_data[0] = iVar21;
            (pDVar18->rect).bottomLeft.m_data[1] = (pDVar9->rect).bottomLeft.m_data[1];
            (pDVar18->rect).topRight.m_data[0] = (pDVar9->rect).topRight.m_data[0];
            (pDVar18->rect).topRight.m_data[1] = (pDVar9->rect).topRight.m_data[1];
            lVar16 = 0x14;
            do {
              uVar1 = *(undefined1 *)((long)(pDVar9->rect).bottomLeft.m_data + lVar16 + -4);
              __args = (Frame *)CONCAT71((int7)((ulong)__args >> 8),uVar1);
              *(undefined1 *)((long)(pDVar18->rect).bottomLeft.m_data + lVar16 + -4) = uVar1;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x17);
            pDVar18 = pDVar18 + 1;
          }
          if (local_b0 != (pointer)0x0) {
            operator_delete(local_b0,uVar15);
            __args = extraout_RDX_01;
          }
          local_98 = pDVar8 + (long)this;
          frameDrawType = local_48;
          lVar16 = local_38;
          uVar13 = local_50;
          local_b0 = pDVar8;
          local_88.draws.
          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
          local_88.draws.
          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
          ._M_impl.super__Vector_impl_data._M_finish = pDVar18;
        }
        else {
          (local_88.draws.
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish)->drawType = DVar2;
          ((local_88.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).bottomLeft.m_data[0] = 0;
          ((local_88.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).bottomLeft.m_data[1] = iVar20;
          ((local_88.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).topRight.m_data[0] = numFrames;
          ((local_88.draws.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->rect).topRight.m_data[1] = iVar21;
          lVar7 = 0;
          do {
            ((local_88.draws.
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish)->rect).color.m_data[lVar7] =
                 *(uchar *)((long)&local_54 + lVar7);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
        }
        local_88.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_88.draws.
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        pDVar12 = (frameDrawType->
                  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar15 = (ulong)((long)(frameDrawType->
                               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) >> 2;
      } while (lVar16 < (int)uVar15);
      __a = (__return_storage_ptr__->
            super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
            )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_88.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = local_b0;
    if (__a == (__return_storage_ptr__->
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pFVar3 = (__return_storage_ptr__->
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)__a - (long)pFVar3 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar13 = (long)__a - (long)pFVar3 >> 5;
      uVar15 = uVar13;
      if (__a == pFVar3) {
        uVar15 = 1;
      }
      uVar19 = uVar15 + uVar13;
      if (0x3fffffffffffffe < uVar19) {
        uVar19 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar15,uVar13)) {
        uVar19 = 0x3ffffffffffffff;
      }
      if (uVar19 == 0) {
        pFVar10 = (pointer)0x0;
      }
      else {
        pFVar10 = (pointer)operator_new(uVar19 << 5);
        __args = extraout_RDX_03;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(pFVar10 + uVar13),&local_88,__args);
      pFVar14 = pFVar10;
      for (pFVar11 = pFVar3; __a != pFVar11; pFVar11 = pFVar11 + 1) {
        iVar17 = pFVar11->height;
        pFVar14->width = pFVar11->width;
        pFVar14->height = iVar17;
        pDVar18 = (pFVar11->draws).
                  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (pFVar14->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pFVar11->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(pFVar14->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl + 8) = pDVar18;
        *(pointer *)
         ((long)&(pFVar14->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl + 0x10) =
             (pFVar11->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar11->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar11->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar11->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar14 = pFVar14 + 1;
      }
      __args = extraout_RDX_04;
      if (pFVar3 != (pointer)0x0) {
        operator_delete(pFVar3,(long)(__return_storage_ptr__->
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar3);
        __args = extraout_RDX_05;
      }
      __a = pFVar14 + 1;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_start = pFVar10;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_finish = __a;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar10 + uVar19;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)__a,&local_88,__args);
      __a = __a + 1;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_finish = __a;
      __args = extraout_RDX_02;
    }
    frameDrawType = local_48;
    if (local_88.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      __args = extraout_RDX_06;
    }
    local_b4 = local_b4 + 1;
  } while (local_b4 != 0x18);
  return (FrameSequence *)(ulong)local_b4;
}

Assistant:

FrameSequence generateFrameSequence (const vector<DrawType>& frameDrawType, de::Random& rnd, int numFrames, int width, int height)
{
	const int			frameDiff		= height / numFrames;
	const GLubyte		r				= rnd.getUint8();
	const GLubyte		g				= rnd.getUint8();
	const GLubyte		b				= rnd.getUint8();
	const Color			color			(r, g, b);
	FrameSequence		frameSequence;

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		Frame frame (width, height);

		for (int rectNdx = 0; rectNdx < (int)frameDrawType.size(); rectNdx++)
		{
			const int			rectHeight		= frameDiff / (int)frameDrawType.size();
			const ColoredRect	rect			(IVec2(0, frameNdx*frameDiff+rectNdx*rectHeight), IVec2(width, frameNdx*frameDiff+(rectNdx+1)*rectHeight), color);
			const DrawCommand	drawCommand		(frameDrawType[rectNdx], rect);

			frame.draws.push_back(drawCommand);
		}
		frameSequence.push_back(frame);
	}
	return frameSequence;
}